

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_vector.cpp
# Opt level: O2

bool __thiscall spvtools::utils::BitVector::Or(BitVector *this,BitVector *other)

{
  const_iterator __position;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last;
  bool bVar1;
  ulong uVar2;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  unsigned_long *puVar3;
  
  puVar3 = (this->bits_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  __position._M_current =
       (this->bits_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  bVar1 = false;
  for (__first._M_current =
            (other->bits_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_start;
      (__last._M_current =
            (other->bits_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_finish, puVar3 != __position._M_current &&
      (__first._M_current != __last._M_current)); __first._M_current = __first._M_current + 1) {
    uVar2 = *__first._M_current | *puVar3;
    if (uVar2 != *puVar3) {
      *puVar3 = uVar2;
      bVar1 = true;
    }
    puVar3 = puVar3 + 1;
  }
  if (__first._M_current != __last._M_current) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)this,__position,__first,__last
              );
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool BitVector::Or(const BitVector& other) {
  auto this_it = this->bits_.begin();
  auto other_it = other.bits_.begin();
  bool modified = false;

  while (this_it != this->bits_.end() && other_it != other.bits_.end()) {
    auto temp = *this_it | *other_it;
    if (temp != *this_it) {
      modified = true;
      *this_it = temp;
    }
    ++this_it;
    ++other_it;
  }

  if (other_it != other.bits_.end()) {
    modified = true;
    this->bits_.insert(this->bits_.end(), other_it, other.bits_.end());
  }

  return modified;
}